

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  BaseNode_conflict *node;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float fVar40;
  undefined1 auVar33 [16];
  float fVar41;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  float fVar42;
  float fVar52;
  float fVar53;
  undefined1 auVar43 [16];
  float fVar54;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar55;
  float fVar65;
  float fVar66;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar67;
  float fVar68;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar82;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  float fVar83;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar71 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  float fVar84;
  float fVar85;
  float fVar93;
  float fVar96;
  float fVar98;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar86;
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar97;
  undefined1 auVar87 [16];
  float fVar99;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar126 [16];
  float fVar123;
  float fVar134;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  float fVar133;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  float fVar141;
  float fVar143;
  float fVar144;
  undefined1 auVar142 [16];
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar147 [64];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar152 [64];
  float fVar156;
  undefined1 auVar157 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar158 [64];
  float fVar162;
  float fVar163;
  undefined1 auVar164 [16];
  float fVar171;
  undefined1 auVar165 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar172;
  undefined1 auVar166 [64];
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar174 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_150d;
  int local_150c;
  undefined8 local_1508;
  float fStack_1500;
  float fStack_14fc;
  undefined1 local_14f8 [16];
  undefined8 local_14e8;
  float fStack_14e0;
  float fStack_14dc;
  Scene *local_14d0;
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [16];
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  undefined1 local_1478 [16];
  long local_1468;
  long local_1460;
  undefined4 local_1458;
  undefined4 local_1454;
  undefined4 local_1450;
  undefined4 local_144c;
  undefined4 local_1448;
  undefined4 local_1444;
  uint local_1440;
  uint local_143c;
  uint local_1438;
  RTCFilterFunctionNArguments local_1428;
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 *local_1358;
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar42 = ray->tfar;
    if (0.0 <= fVar42) {
      aVar5 = (ray->dir).field_0;
      auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar80._8_4_ = 0x7fffffff;
      auVar80._0_8_ = 0x7fffffff7fffffff;
      auVar80._12_4_ = 0x7fffffff;
      auVar80 = vandps_avx((undefined1  [16])aVar5,auVar80);
      auVar100._8_4_ = 0x219392ef;
      auVar100._0_8_ = 0x219392ef219392ef;
      auVar100._12_4_ = 0x219392ef;
      auVar80 = vcmpps_avx(auVar80,auVar100,1);
      auVar80 = vblendvps_avx((undefined1  [16])aVar5,auVar100,auVar80);
      puVar28 = local_11d0;
      auVar100 = vrcpps_avx(auVar80);
      fVar84 = auVar100._0_4_;
      auVar69._0_4_ = fVar84 * auVar80._0_4_;
      fVar92 = auVar100._4_4_;
      auVar69._4_4_ = fVar92 * auVar80._4_4_;
      fVar95 = auVar100._8_4_;
      auVar69._8_4_ = fVar95 * auVar80._8_4_;
      fVar65 = auVar100._12_4_;
      auVar69._12_4_ = fVar65 * auVar80._12_4_;
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = 0x3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar80 = vsubps_avx(auVar101,auVar69);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar147 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar152 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar158 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      auVar70._0_4_ = fVar84 + fVar84 * auVar80._0_4_;
      auVar70._4_4_ = fVar92 + fVar92 * auVar80._4_4_;
      auVar70._8_4_ = fVar95 + fVar95 * auVar80._8_4_;
      auVar70._12_4_ = fVar65 + fVar65 * auVar80._12_4_;
      auVar80 = vshufps_avx(auVar70,auVar70,0);
      auVar166 = ZEXT3264(CONCAT1616(auVar80,auVar80));
      auVar80 = vmovshdup_avx(auVar70);
      auVar100 = vshufps_avx(auVar70,auVar70,0x55);
      auVar174 = ZEXT3264(CONCAT1616(auVar100,auVar100));
      auVar100 = vshufpd_avx(auVar70,auVar70,1);
      auVar69 = vshufps_avx(auVar70,auVar70,0xaa);
      local_11f8._16_16_ = auVar69;
      local_11f8._0_16_ = auVar69;
      uVar29 = (ulong)(auVar70._0_4_ < 0.0) << 3;
      uVar20 = (ulong)(auVar80._0_4_ < 0.0);
      lVar1 = uVar20 * 8;
      uVar21 = (ulong)(auVar100._0_4_ < 0.0);
      lVar2 = uVar21 * 8;
      auVar80 = vshufps_avx(auVar44,auVar44,0);
      local_1218._16_16_ = auVar80;
      local_1218._0_16_ = auVar80;
      auVar80 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
      local_1238._16_16_ = auVar80;
      local_1238._0_16_ = auVar80;
      uVar30 = uVar29 ^ 8;
      uVar27 = lVar1 + 0x10U ^ 8;
      uVar32 = lVar2 + 0x20U ^ 8;
      local_13f8 = mm_lookupmask_ps._240_16_;
      do {
        uVar31 = puVar28[-1];
        puVar28 = puVar28 + -1;
        while( true ) {
          local_1258 = auVar147._0_32_;
          local_1278 = auVar152._0_32_;
          local_1298 = auVar158._0_32_;
          if ((uVar31 & 8) != 0) break;
          uVar22 = uVar31 & 0xfffffffffffffff0;
          puVar25 = (ulong *)(uVar22 + 0x40);
          if (uVar22 == 0) {
            puVar25 = (ulong *)0x0;
          }
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *puVar25;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = puVar25[1];
          auVar80 = vpminub_avx(auVar33,auVar56);
          auVar80 = vpcmpeqb_avx(auVar33,auVar80);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)((long)puVar25 + 4);
          auVar71._8_8_ = 0;
          auVar71._0_8_ = *(ulong *)((long)puVar25 + 0xc);
          auVar44 = vpminub_avx(auVar43,auVar71);
          fVar42 = *(float *)(puVar25 + 6);
          auVar44 = vpcmpeqb_avx(auVar43,auVar44);
          fVar84 = *(float *)((long)puVar25 + 0x3c);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)((long)puVar25 + uVar29);
          auVar100 = vpmovzxbd_avx(auVar57);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = *(ulong *)((long)puVar25 + uVar29 + 4);
          auVar69 = vpmovzxbd_avx(auVar102);
          auVar63._16_16_ = auVar69;
          auVar63._0_16_ = auVar100;
          auVar63 = vcvtdq2ps_avx(auVar63);
          auVar64._0_4_ = fVar42 + fVar84 * auVar63._0_4_;
          auVar64._4_4_ = fVar42 + fVar84 * auVar63._4_4_;
          auVar64._8_4_ = fVar42 + fVar84 * auVar63._8_4_;
          auVar64._12_4_ = fVar42 + fVar84 * auVar63._12_4_;
          auVar64._16_4_ = fVar42 + fVar84 * auVar63._16_4_;
          auVar64._20_4_ = fVar42 + fVar84 * auVar63._20_4_;
          auVar64._24_4_ = fVar42 + fVar84 * auVar63._24_4_;
          auVar64._28_4_ = fVar42 + auVar63._28_4_;
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)((long)puVar25 + uVar30);
          auVar100 = vpmovzxbd_avx(auVar103);
          auVar109._8_8_ = 0;
          auVar109._0_8_ = *(ulong *)((long)puVar25 + uVar30 + 4);
          auVar69 = vpmovzxbd_avx(auVar109);
          auVar107._16_16_ = auVar69;
          auVar107._0_16_ = auVar100;
          auVar63 = vcvtdq2ps_avx(auVar107);
          fVar92 = *(float *)((long)puVar25 + 0x34);
          auVar81._0_4_ = fVar42 + fVar84 * auVar63._0_4_;
          auVar81._4_4_ = fVar42 + fVar84 * auVar63._4_4_;
          auVar81._8_4_ = fVar42 + fVar84 * auVar63._8_4_;
          auVar81._12_4_ = fVar42 + fVar84 * auVar63._12_4_;
          auVar81._16_4_ = fVar42 + fVar84 * auVar63._16_4_;
          auVar81._20_4_ = fVar42 + fVar84 * auVar63._20_4_;
          auVar81._24_4_ = fVar42 + fVar84 * auVar63._24_4_;
          auVar81._28_4_ = fVar42 + fVar84;
          fVar42 = *(float *)(puVar25 + 8);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = puVar25[uVar20 + 2];
          auVar100 = vpmovzxbd_avx(auVar87);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)((long)puVar25 + lVar1 + 0x14);
          auVar69 = vpmovzxbd_avx(auVar114);
          auVar90._16_16_ = auVar69;
          auVar90._0_16_ = auVar100;
          auVar63 = vcvtdq2ps_avx(auVar90);
          auVar91._0_4_ = fVar92 + fVar42 * auVar63._0_4_;
          auVar91._4_4_ = fVar92 + fVar42 * auVar63._4_4_;
          auVar91._8_4_ = fVar92 + fVar42 * auVar63._8_4_;
          auVar91._12_4_ = fVar92 + fVar42 * auVar63._12_4_;
          auVar91._16_4_ = fVar92 + fVar42 * auVar63._16_4_;
          auVar91._20_4_ = fVar92 + fVar42 * auVar63._20_4_;
          auVar91._24_4_ = fVar92 + fVar42 * auVar63._24_4_;
          auVar91._28_4_ = fVar92 + auVar63._28_4_;
          auVar115._8_8_ = 0;
          auVar115._0_8_ = *(ulong *)((long)puVar25 + uVar27);
          auVar100 = vpmovzxbd_avx(auVar115);
          auVar124._8_8_ = 0;
          auVar124._0_8_ = *(ulong *)((long)puVar25 + uVar27 + 4);
          auVar69 = vpmovzxbd_avx(auVar124);
          auVar122._16_16_ = auVar69;
          auVar122._0_16_ = auVar100;
          auVar63 = vcvtdq2ps_avx(auVar122);
          fVar84 = *(float *)(puVar25 + 7);
          auVar108._0_4_ = fVar92 + fVar42 * auVar63._0_4_;
          auVar108._4_4_ = fVar92 + fVar42 * auVar63._4_4_;
          auVar108._8_4_ = fVar92 + fVar42 * auVar63._8_4_;
          auVar108._12_4_ = fVar92 + fVar42 * auVar63._12_4_;
          auVar108._16_4_ = fVar92 + fVar42 * auVar63._16_4_;
          auVar108._20_4_ = fVar92 + fVar42 * auVar63._20_4_;
          auVar108._24_4_ = fVar92 + fVar42 * auVar63._24_4_;
          auVar108._28_4_ = fVar92 + fVar42;
          fVar42 = *(float *)((long)puVar25 + 0x44);
          auVar125._8_8_ = 0;
          auVar125._0_8_ = puVar25[uVar21 + 4];
          auVar100 = vpmovzxbd_avx(auVar125);
          auVar135._8_8_ = 0;
          auVar135._0_8_ = *(ulong *)((long)puVar25 + lVar2 + 0x24);
          auVar69 = vpmovzxbd_avx(auVar135);
          auVar130._16_16_ = auVar69;
          auVar130._0_16_ = auVar100;
          auVar136._8_8_ = 0;
          auVar136._0_8_ = *(ulong *)((long)puVar25 + uVar32);
          auVar100 = vpmovzxbd_avx(auVar136);
          auVar142._8_8_ = 0;
          auVar142._0_8_ = *(ulong *)((long)puVar25 + uVar32 + 4);
          auVar69 = vpmovzxbd_avx(auVar142);
          auVar140._16_16_ = auVar69;
          auVar140._0_16_ = auVar100;
          auVar63 = vcvtdq2ps_avx(auVar130);
          auVar14 = vcvtdq2ps_avx(auVar140);
          auVar131._0_4_ = auVar63._0_4_ * fVar42 + fVar84;
          auVar131._4_4_ = auVar63._4_4_ * fVar42 + fVar84;
          auVar131._8_4_ = auVar63._8_4_ * fVar42 + fVar84;
          auVar131._12_4_ = auVar63._12_4_ * fVar42 + fVar84;
          auVar131._16_4_ = auVar63._16_4_ * fVar42 + fVar84;
          auVar131._20_4_ = auVar63._20_4_ * fVar42 + fVar84;
          auVar131._24_4_ = auVar63._24_4_ * fVar42 + fVar84;
          auVar131._28_4_ = auVar63._28_4_ + fVar84;
          auVar113._0_4_ = fVar84 + auVar14._0_4_ * fVar42;
          auVar113._4_4_ = fVar84 + auVar14._4_4_ * fVar42;
          auVar113._8_4_ = fVar84 + auVar14._8_4_ * fVar42;
          auVar113._12_4_ = fVar84 + auVar14._12_4_ * fVar42;
          auVar113._16_4_ = fVar84 + auVar14._16_4_ * fVar42;
          auVar113._20_4_ = fVar84 + auVar14._20_4_ * fVar42;
          auVar113._24_4_ = fVar84 + auVar14._24_4_ * fVar42;
          auVar113._28_4_ = fVar84 + fVar42;
          auVar63 = vsubps_avx(auVar64,local_1258);
          auVar14._4_4_ = auVar166._4_4_ * auVar63._4_4_;
          auVar14._0_4_ = auVar166._0_4_ * auVar63._0_4_;
          auVar14._8_4_ = auVar166._8_4_ * auVar63._8_4_;
          auVar14._12_4_ = auVar166._12_4_ * auVar63._12_4_;
          auVar14._16_4_ = auVar166._16_4_ * auVar63._16_4_;
          auVar14._20_4_ = auVar166._20_4_ * auVar63._20_4_;
          auVar14._24_4_ = auVar166._24_4_ * auVar63._24_4_;
          auVar14._28_4_ = auVar63._28_4_;
          auVar63 = vsubps_avx(auVar91,local_1278);
          auVar15._4_4_ = auVar174._4_4_ * auVar63._4_4_;
          auVar15._0_4_ = auVar174._0_4_ * auVar63._0_4_;
          auVar15._8_4_ = auVar174._8_4_ * auVar63._8_4_;
          auVar15._12_4_ = auVar174._12_4_ * auVar63._12_4_;
          auVar15._16_4_ = auVar174._16_4_ * auVar63._16_4_;
          auVar15._20_4_ = auVar174._20_4_ * auVar63._20_4_;
          auVar15._24_4_ = auVar174._24_4_ * auVar63._24_4_;
          auVar15._28_4_ = auVar63._28_4_;
          auVar63 = vmaxps_avx(auVar14,auVar15);
          auVar14 = vsubps_avx(auVar131,local_1298);
          auVar16._4_4_ = local_11f8._4_4_ * auVar14._4_4_;
          auVar16._0_4_ = local_11f8._0_4_ * auVar14._0_4_;
          auVar16._8_4_ = local_11f8._8_4_ * auVar14._8_4_;
          auVar16._12_4_ = local_11f8._12_4_ * auVar14._12_4_;
          auVar16._16_4_ = local_11f8._16_4_ * auVar14._16_4_;
          auVar16._20_4_ = local_11f8._20_4_ * auVar14._20_4_;
          auVar16._24_4_ = local_11f8._24_4_ * auVar14._24_4_;
          auVar16._28_4_ = auVar14._28_4_;
          auVar14 = vmaxps_avx(auVar16,local_1218);
          auVar63 = vmaxps_avx(auVar63,auVar14);
          auVar14 = vsubps_avx(auVar81,local_1258);
          auVar17._4_4_ = auVar166._4_4_ * auVar14._4_4_;
          auVar17._0_4_ = auVar166._0_4_ * auVar14._0_4_;
          auVar17._8_4_ = auVar166._8_4_ * auVar14._8_4_;
          auVar17._12_4_ = auVar166._12_4_ * auVar14._12_4_;
          auVar17._16_4_ = auVar166._16_4_ * auVar14._16_4_;
          auVar17._20_4_ = auVar166._20_4_ * auVar14._20_4_;
          auVar17._24_4_ = auVar166._24_4_ * auVar14._24_4_;
          auVar17._28_4_ = auVar14._28_4_;
          auVar14 = vsubps_avx(auVar108,local_1278);
          auVar18._4_4_ = auVar174._4_4_ * auVar14._4_4_;
          auVar18._0_4_ = auVar174._0_4_ * auVar14._0_4_;
          auVar18._8_4_ = auVar174._8_4_ * auVar14._8_4_;
          auVar18._12_4_ = auVar174._12_4_ * auVar14._12_4_;
          auVar18._16_4_ = auVar174._16_4_ * auVar14._16_4_;
          auVar18._20_4_ = auVar174._20_4_ * auVar14._20_4_;
          auVar18._24_4_ = auVar174._24_4_ * auVar14._24_4_;
          auVar18._28_4_ = auVar14._28_4_;
          auVar14 = vminps_avx(auVar17,auVar18);
          auVar15 = vsubps_avx(auVar113,local_1298);
          auVar19._4_4_ = local_11f8._4_4_ * auVar15._4_4_;
          auVar19._0_4_ = local_11f8._0_4_ * auVar15._0_4_;
          auVar19._8_4_ = local_11f8._8_4_ * auVar15._8_4_;
          auVar19._12_4_ = local_11f8._12_4_ * auVar15._12_4_;
          auVar19._16_4_ = local_11f8._16_4_ * auVar15._16_4_;
          auVar19._20_4_ = local_11f8._20_4_ * auVar15._20_4_;
          auVar19._24_4_ = local_11f8._24_4_ * auVar15._24_4_;
          auVar19._28_4_ = auVar15._28_4_;
          auVar15 = vminps_avx(auVar19,local_1238);
          auVar14 = vminps_avx(auVar14,auVar15);
          auVar63 = vcmpps_avx(auVar63,auVar14,2);
          auVar100 = vpcmpeqd_avx(auVar14._0_16_,auVar14._0_16_);
          auVar80 = vpmovsxbd_avx(auVar80 ^ auVar100);
          auVar44 = vpmovsxbd_avx(auVar44 ^ auVar100);
          auVar39._16_16_ = auVar44;
          auVar39._0_16_ = auVar80;
          auVar14 = vcvtdq2ps_avx(auVar39);
          auVar51._8_4_ = 0xbf800000;
          auVar51._0_8_ = 0xbf800000bf800000;
          auVar51._12_4_ = 0xbf800000;
          auVar51._16_4_ = 0xbf800000;
          auVar51._20_4_ = 0xbf800000;
          auVar51._24_4_ = 0xbf800000;
          auVar51._28_4_ = 0xbf800000;
          auVar14 = vcmpps_avx(auVar51,auVar14,1);
          auVar63 = vandps_avx(auVar63,auVar14);
          uVar24 = vmovmskps_avx(auVar63);
          if (uVar24 == 0) goto LAB_002eef8c;
          lVar23 = 0;
          if ((byte)uVar24 != 0) {
            for (; ((byte)uVar24 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          uVar31 = *(ulong *)(uVar22 + lVar23 * 8);
          uVar24 = (uVar24 & 0xff) - 1 & uVar24 & 0xff;
          if (uVar24 != 0) {
            *puVar28 = uVar31;
            puVar28 = puVar28 + 1;
            lVar23 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            uVar31 = *(ulong *)(uVar22 + lVar23 * 8);
            uVar24 = uVar24 - 1 & uVar24;
            uVar26 = (ulong)uVar24;
            if (uVar24 != 0) {
              do {
                *puVar28 = uVar31;
                puVar28 = puVar28 + 1;
                lVar23 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                uVar31 = *(ulong *)(uVar22 + lVar23 * 8);
                uVar26 = uVar26 & uVar26 - 1;
              } while (uVar26 != 0);
            }
          }
        }
        local_1468 = (ulong)((uint)uVar31 & 0xf) - 8;
        if (local_1468 != 0) {
          uVar31 = uVar31 & 0xfffffffffffffff0;
          local_1460 = 0;
          local_12b8 = auVar166._0_32_;
          local_12d8 = auVar174._0_32_;
          local_14d0 = context->scene;
          do {
            lVar23 = local_1460 * 0x50;
            ppfVar6 = (local_14d0->vertices).items;
            pfVar7 = ppfVar6[*(uint *)(uVar31 + 0x30 + lVar23)];
            pfVar8 = ppfVar6[*(uint *)(uVar31 + 0x34 + lVar23)];
            pfVar9 = ppfVar6[*(uint *)(uVar31 + 0x38 + lVar23)];
            pfVar10 = ppfVar6[*(uint *)(uVar31 + 0x3c + lVar23)];
            auVar100 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + lVar23)),
                                     *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar31 + 8 + lVar23))
                                    );
            auVar80 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + lVar23)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar31 + 8 + lVar23)))
            ;
            auVar69 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 4 + lVar23)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0xc + lVar23)));
            auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 4 + lVar23)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0xc + lVar23)));
            auVar101 = vunpcklps_avx(auVar80,auVar44);
            auVar45 = vunpcklps_avx(auVar100,auVar69);
            auVar80 = vunpckhps_avx(auVar100,auVar69);
            auVar69 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar31 + 0x10 + lVar23)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar31 + 0x18 + lVar23)));
            auVar44 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar31 + 0x10 + lVar23)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar31 + 0x18 + lVar23)));
            auVar70 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar31 + 0x14 + lVar23)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0x1c + lVar23)));
            auVar100 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar31 + 0x14 + lVar23)),
                                     *(undefined1 (*) [16])
                                      (pfVar10 + *(uint *)(uVar31 + 0x1c + lVar23)));
            auVar58 = vunpcklps_avx(auVar44,auVar100);
            auVar34 = vunpcklps_avx(auVar69,auVar70);
            auVar44 = vunpckhps_avx(auVar69,auVar70);
            auVar70 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar31 + 0x20 + lVar23)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar31 + 0x28 + lVar23)));
            auVar100 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar31 + 0x20 + lVar23)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar31 + 0x28 + lVar23)));
            auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar31 + 0x24 + lVar23)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0x2c + lVar23)));
            auVar69 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar31 + 0x24 + lVar23)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0x2c + lVar23)));
            auVar72 = vunpcklps_avx(auVar100,auVar69);
            auVar69 = vunpcklps_avx(auVar70,auVar35);
            auVar70 = vunpckhps_avx(auVar70,auVar35);
            puVar3 = (undefined8 *)(uVar31 + 0x30 + lVar23);
            local_1398 = *puVar3;
            uStack_1390 = puVar3[1];
            puVar3 = (undefined8 *)(uVar31 + 0x40 + lVar23);
            local_13a8 = *puVar3;
            uStack_13a0 = puVar3[1];
            uVar4 = *(undefined4 *)&(ray->org).field_0;
            auVar137._4_4_ = uVar4;
            auVar137._0_4_ = uVar4;
            auVar137._8_4_ = uVar4;
            auVar137._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar157._4_4_ = uVar4;
            auVar157._0_4_ = uVar4;
            auVar157._8_4_ = uVar4;
            auVar157._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar164._4_4_ = uVar4;
            auVar164._0_4_ = uVar4;
            auVar164._8_4_ = uVar4;
            auVar164._12_4_ = uVar4;
            local_1478 = vsubps_avx(auVar45,auVar137);
            local_1488 = vsubps_avx(auVar80,auVar157);
            local_1498 = vsubps_avx(auVar101,auVar164);
            auVar80 = vsubps_avx(auVar34,auVar137);
            auVar44 = vsubps_avx(auVar44,auVar157);
            auVar100 = vsubps_avx(auVar58,auVar164);
            auVar69 = vsubps_avx(auVar69,auVar137);
            auVar70 = vsubps_avx(auVar70,auVar157);
            auVar101 = vsubps_avx(auVar72,auVar164);
            local_14a8 = vsubps_avx(auVar69,local_1478);
            local_14b8 = vsubps_avx(auVar70,local_1488);
            local_14c8 = vsubps_avx(auVar101,local_1498);
            fVar84 = local_1488._0_4_;
            fVar42 = auVar70._0_4_ + fVar84;
            fVar95 = local_1488._4_4_;
            fVar52 = auVar70._4_4_ + fVar95;
            fVar67 = local_1488._8_4_;
            fVar53 = auVar70._8_4_ + fVar67;
            fVar12 = local_1488._12_4_;
            fVar54 = auVar70._12_4_ + fVar12;
            fVar141 = local_1498._0_4_;
            fVar85 = fVar141 + auVar101._0_4_;
            fVar143 = local_1498._4_4_;
            fVar93 = fVar143 + auVar101._4_4_;
            fVar144 = local_1498._8_4_;
            fVar96 = fVar144 + auVar101._8_4_;
            fVar145 = local_1498._12_4_;
            fVar98 = fVar145 + auVar101._12_4_;
            fVar55 = local_14c8._0_4_;
            auVar126._0_4_ = fVar55 * fVar42;
            fVar66 = local_14c8._4_4_;
            auVar126._4_4_ = fVar66 * fVar52;
            fVar40 = local_14c8._8_4_;
            auVar126._8_4_ = fVar40 * fVar53;
            fVar41 = local_14c8._12_4_;
            auVar126._12_4_ = fVar41 * fVar54;
            fVar173 = local_14b8._0_4_;
            auVar138._0_4_ = fVar173 * fVar85;
            fVar175 = local_14b8._4_4_;
            auVar138._4_4_ = fVar175 * fVar93;
            fVar176 = local_14b8._8_4_;
            auVar138._8_4_ = fVar176 * fVar96;
            fVar177 = local_14b8._12_4_;
            auVar138._12_4_ = fVar177 * fVar98;
            auVar45 = vsubps_avx(auVar138,auVar126);
            fVar92 = local_1478._0_4_;
            fVar123 = auVar69._0_4_ + fVar92;
            fVar65 = local_1478._4_4_;
            fVar132 = auVar69._4_4_ + fVar65;
            fVar68 = local_1478._8_4_;
            fVar133 = auVar69._8_4_ + fVar68;
            fVar13 = local_1478._12_4_;
            fVar134 = auVar69._12_4_ + fVar13;
            fVar162 = local_14a8._0_4_;
            auVar88._0_4_ = fVar162 * fVar85;
            fVar167 = local_14a8._4_4_;
            auVar88._4_4_ = fVar167 * fVar93;
            fVar169 = local_14a8._8_4_;
            auVar88._8_4_ = fVar169 * fVar96;
            fVar171 = local_14a8._12_4_;
            auVar88._12_4_ = fVar171 * fVar98;
            auVar139._0_4_ = fVar123 * fVar55;
            auVar139._4_4_ = fVar132 * fVar66;
            auVar139._8_4_ = fVar133 * fVar40;
            auVar139._12_4_ = fVar134 * fVar41;
            auVar58 = vsubps_avx(auVar139,auVar88);
            auVar127._0_4_ = fVar173 * fVar123;
            auVar127._4_4_ = fVar175 * fVar132;
            auVar127._8_4_ = fVar176 * fVar133;
            auVar127._12_4_ = fVar177 * fVar134;
            auVar34._0_4_ = fVar162 * fVar42;
            auVar34._4_4_ = fVar167 * fVar52;
            auVar34._8_4_ = fVar169 * fVar53;
            auVar34._12_4_ = fVar171 * fVar54;
            auVar34 = vsubps_avx(auVar34,auVar127);
            fVar42 = (ray->dir).field_0.m128[2];
            local_14f8._4_4_ = fVar42;
            local_14f8._0_4_ = fVar42;
            local_14f8._8_4_ = fVar42;
            local_14f8._12_4_ = fVar42;
            local_1508._4_4_ = (ray->dir).field_0.m128[1];
            fStack_14e0 = (ray->dir).field_0.m128[0];
            local_14e8 = (RTCIntersectArguments *)CONCAT44(fStack_14e0,fStack_14e0);
            fStack_14dc = fStack_14e0;
            local_13c8._0_4_ =
                 auVar45._0_4_ * fStack_14e0 +
                 local_1508._4_4_ * auVar58._0_4_ + fVar42 * auVar34._0_4_;
            local_13c8._4_4_ =
                 auVar45._4_4_ * fStack_14e0 +
                 local_1508._4_4_ * auVar58._4_4_ + fVar42 * auVar34._4_4_;
            local_13c8._8_4_ =
                 auVar45._8_4_ * fStack_14e0 +
                 local_1508._4_4_ * auVar58._8_4_ + fVar42 * auVar34._8_4_;
            local_13c8._12_4_ =
                 auVar45._12_4_ * fStack_14e0 +
                 local_1508._4_4_ * auVar58._12_4_ + fVar42 * auVar34._12_4_;
            local_13b8 = vsubps_avx(local_1488,auVar44);
            auVar45 = vsubps_avx(local_1498,auVar100);
            fVar52 = fVar84 + auVar44._0_4_;
            fVar53 = fVar95 + auVar44._4_4_;
            fVar54 = fVar67 + auVar44._8_4_;
            fVar85 = fVar12 + auVar44._12_4_;
            fVar93 = fVar141 + auVar100._0_4_;
            fVar96 = fVar143 + auVar100._4_4_;
            fVar98 = fVar144 + auVar100._8_4_;
            fVar123 = fVar145 + auVar100._12_4_;
            fVar146 = auVar45._0_4_;
            auVar165._0_4_ = fVar146 * fVar52;
            fVar148 = auVar45._4_4_;
            auVar165._4_4_ = fVar148 * fVar53;
            fVar149 = auVar45._8_4_;
            auVar165._8_4_ = fVar149 * fVar54;
            fVar150 = auVar45._12_4_;
            auVar165._12_4_ = fVar150 * fVar85;
            fVar156 = local_13b8._0_4_;
            auVar72._0_4_ = fVar156 * fVar93;
            fVar159 = local_13b8._4_4_;
            auVar72._4_4_ = fVar159 * fVar96;
            fVar160 = local_13b8._8_4_;
            auVar72._8_4_ = fVar160 * fVar98;
            fVar161 = local_13b8._12_4_;
            auVar72._12_4_ = fVar161 * fVar123;
            auVar45 = vsubps_avx(auVar72,auVar165);
            auVar58 = vsubps_avx(local_1478,auVar80);
            fVar163 = auVar58._0_4_;
            auVar89._0_4_ = fVar163 * fVar93;
            fVar168 = auVar58._4_4_;
            auVar89._4_4_ = fVar168 * fVar96;
            fVar170 = auVar58._8_4_;
            auVar89._8_4_ = fVar170 * fVar98;
            fVar172 = auVar58._12_4_;
            auVar89._12_4_ = fVar172 * fVar123;
            fVar93 = fVar92 + auVar80._0_4_;
            fVar96 = fVar65 + auVar80._4_4_;
            fVar98 = fVar68 + auVar80._8_4_;
            fVar123 = fVar13 + auVar80._12_4_;
            auVar128._0_4_ = fVar146 * fVar93;
            auVar128._4_4_ = fVar148 * fVar96;
            auVar128._8_4_ = fVar149 * fVar98;
            auVar128._12_4_ = fVar150 * fVar123;
            auVar58 = vsubps_avx(auVar128,auVar89);
            auVar116._0_4_ = fVar156 * fVar93;
            auVar116._4_4_ = fVar159 * fVar96;
            auVar116._8_4_ = fVar160 * fVar98;
            auVar116._12_4_ = fVar161 * fVar123;
            auVar35._0_4_ = fVar163 * fVar52;
            auVar35._4_4_ = fVar168 * fVar53;
            auVar35._8_4_ = fVar170 * fVar54;
            auVar35._12_4_ = fVar172 * fVar85;
            auVar34 = vsubps_avx(auVar35,auVar116);
            local_1378._0_4_ =
                 fStack_14e0 * auVar45._0_4_ +
                 local_1508._4_4_ * auVar58._0_4_ + fVar42 * auVar34._0_4_;
            local_1378._4_4_ =
                 fStack_14e0 * auVar45._4_4_ +
                 local_1508._4_4_ * auVar58._4_4_ + fVar42 * auVar34._4_4_;
            local_1378._8_4_ =
                 fStack_14e0 * auVar45._8_4_ +
                 local_1508._4_4_ * auVar58._8_4_ + fVar42 * auVar34._8_4_;
            local_1378._12_4_ =
                 fStack_14e0 * auVar45._12_4_ +
                 local_1508._4_4_ * auVar58._12_4_ + fVar42 * auVar34._12_4_;
            auVar45 = vsubps_avx(auVar80,auVar69);
            fVar133 = auVar69._0_4_ + auVar80._0_4_;
            fVar134 = auVar69._4_4_ + auVar80._4_4_;
            fVar82 = auVar69._8_4_ + auVar80._8_4_;
            fVar83 = auVar69._12_4_ + auVar80._12_4_;
            auVar80 = vsubps_avx(auVar44,auVar70);
            fVar96 = auVar44._0_4_ + auVar70._0_4_;
            fVar98 = auVar44._4_4_ + auVar70._4_4_;
            fVar123 = auVar44._8_4_ + auVar70._8_4_;
            fVar132 = auVar44._12_4_ + auVar70._12_4_;
            auVar44 = vsubps_avx(auVar100,auVar101);
            fVar53 = auVar100._0_4_ + auVar101._0_4_;
            fVar54 = auVar100._4_4_ + auVar101._4_4_;
            fVar85 = auVar100._8_4_ + auVar101._8_4_;
            fVar93 = auVar100._12_4_ + auVar101._12_4_;
            fVar86 = auVar44._0_4_;
            auVar104._0_4_ = fVar86 * fVar96;
            fVar94 = auVar44._4_4_;
            auVar104._4_4_ = fVar94 * fVar98;
            fVar97 = auVar44._8_4_;
            auVar104._8_4_ = fVar97 * fVar123;
            fVar99 = auVar44._12_4_;
            auVar104._12_4_ = fVar99 * fVar132;
            fVar151 = auVar80._0_4_;
            auVar117._0_4_ = fVar151 * fVar53;
            fVar153 = auVar80._4_4_;
            auVar117._4_4_ = fVar153 * fVar54;
            fVar154 = auVar80._8_4_;
            auVar117._8_4_ = fVar154 * fVar85;
            fVar155 = auVar80._12_4_;
            auVar117._12_4_ = fVar155 * fVar93;
            auVar80 = vsubps_avx(auVar117,auVar104);
            fVar52 = auVar45._0_4_;
            auVar44._0_4_ = fVar52 * fVar53;
            fVar53 = auVar45._4_4_;
            auVar44._4_4_ = fVar53 * fVar54;
            fVar54 = auVar45._8_4_;
            auVar44._8_4_ = fVar54 * fVar85;
            fVar85 = auVar45._12_4_;
            auVar44._12_4_ = fVar85 * fVar93;
            auVar118._0_4_ = fVar86 * fVar133;
            auVar118._4_4_ = fVar94 * fVar134;
            auVar118._8_4_ = fVar97 * fVar82;
            auVar118._12_4_ = fVar99 * fVar83;
            auVar44 = vsubps_avx(auVar118,auVar44);
            auVar73._0_4_ = fVar151 * fVar133;
            auVar73._4_4_ = fVar153 * fVar134;
            auVar73._8_4_ = fVar154 * fVar82;
            auVar73._12_4_ = fVar155 * fVar83;
            auVar58._0_4_ = fVar52 * fVar96;
            auVar58._4_4_ = fVar53 * fVar98;
            auVar58._8_4_ = fVar54 * fVar123;
            auVar58._12_4_ = fVar85 * fVar132;
            auVar100 = vsubps_avx(auVar58,auVar73);
            local_1508._0_4_ = local_1508._4_4_;
            fStack_1500 = local_1508._4_4_;
            fStack_14fc = local_1508._4_4_;
            auVar45._0_4_ =
                 fStack_14e0 * auVar80._0_4_ +
                 local_1508._4_4_ * auVar44._0_4_ + fVar42 * auVar100._0_4_;
            auVar45._4_4_ =
                 fStack_14e0 * auVar80._4_4_ +
                 local_1508._4_4_ * auVar44._4_4_ + fVar42 * auVar100._4_4_;
            auVar45._8_4_ =
                 fStack_14e0 * auVar80._8_4_ +
                 local_1508._4_4_ * auVar44._8_4_ + fVar42 * auVar100._8_4_;
            auVar45._12_4_ =
                 fStack_14e0 * auVar80._12_4_ +
                 local_1508._4_4_ * auVar44._12_4_ + fVar42 * auVar100._12_4_;
            local_1368._0_4_ = auVar45._0_4_ + local_13c8._0_4_ + local_1378._0_4_;
            local_1368._4_4_ = auVar45._4_4_ + local_13c8._4_4_ + local_1378._4_4_;
            local_1368._8_4_ = auVar45._8_4_ + local_13c8._8_4_ + local_1378._8_4_;
            local_1368._12_4_ = auVar45._12_4_ + local_13c8._12_4_ + local_1378._12_4_;
            auVar80 = vminps_avx(local_13c8,local_1378);
            auVar80 = vminps_avx(auVar80,auVar45);
            auVar74._8_4_ = 0x7fffffff;
            auVar74._0_8_ = 0x7fffffff7fffffff;
            auVar74._12_4_ = 0x7fffffff;
            local_13d8 = vandps_avx(local_1368,auVar74);
            auVar75._0_4_ = local_13d8._0_4_ * 1.1920929e-07;
            auVar75._4_4_ = local_13d8._4_4_ * 1.1920929e-07;
            auVar75._8_4_ = local_13d8._8_4_ * 1.1920929e-07;
            auVar75._12_4_ = local_13d8._12_4_ * 1.1920929e-07;
            uVar22 = CONCAT44(auVar75._4_4_,auVar75._0_4_);
            auVar105._0_8_ = uVar22 ^ 0x8000000080000000;
            auVar105._8_4_ = -auVar75._8_4_;
            auVar105._12_4_ = -auVar75._12_4_;
            auVar80 = vcmpps_avx(auVar80,auVar105,5);
            auVar44 = vmaxps_avx(local_13c8,local_1378);
            auVar44 = vmaxps_avx(auVar44,auVar45);
            auVar44 = vcmpps_avx(auVar44,auVar75,2);
            local_13e8 = vorps_avx(auVar80,auVar44);
            local_150d = 0;
            auVar80 = local_13f8 & local_13e8;
            if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar80[0xf] < '\0') {
              auVar46._0_4_ = fVar55 * fVar156;
              auVar46._4_4_ = fVar66 * fVar159;
              auVar46._8_4_ = fVar40 * fVar160;
              auVar46._12_4_ = fVar41 * fVar161;
              auVar59._0_4_ = fVar173 * fVar146;
              auVar59._4_4_ = fVar175 * fVar148;
              auVar59._8_4_ = fVar176 * fVar149;
              auVar59._12_4_ = fVar177 * fVar150;
              auVar100 = vsubps_avx(auVar59,auVar46);
              auVar76._0_4_ = fVar146 * fVar151;
              auVar76._4_4_ = fVar148 * fVar153;
              auVar76._8_4_ = fVar149 * fVar154;
              auVar76._12_4_ = fVar150 * fVar155;
              auVar106._0_4_ = fVar156 * fVar86;
              auVar106._4_4_ = fVar159 * fVar94;
              auVar106._8_4_ = fVar160 * fVar97;
              auVar106._12_4_ = fVar161 * fVar99;
              auVar69 = vsubps_avx(auVar106,auVar76);
              auVar119._8_4_ = 0x7fffffff;
              auVar119._0_8_ = 0x7fffffff7fffffff;
              auVar119._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx(auVar46,auVar119);
              auVar44 = vandps_avx(auVar76,auVar119);
              auVar80 = vcmpps_avx(auVar80,auVar44,1);
              local_1308 = vblendvps_avx(auVar69,auVar100,auVar80);
              auVar47._0_4_ = fVar163 * fVar86;
              auVar47._4_4_ = fVar168 * fVar94;
              auVar47._8_4_ = fVar170 * fVar97;
              auVar47._12_4_ = fVar172 * fVar99;
              auVar60._0_4_ = fVar55 * fVar163;
              auVar60._4_4_ = fVar66 * fVar168;
              auVar60._8_4_ = fVar40 * fVar170;
              auVar60._12_4_ = fVar41 * fVar172;
              auVar77._0_4_ = fVar162 * fVar146;
              auVar77._4_4_ = fVar167 * fVar148;
              auVar77._8_4_ = fVar169 * fVar149;
              auVar77._12_4_ = fVar171 * fVar150;
              auVar100 = vsubps_avx(auVar60,auVar77);
              auVar110._0_4_ = fVar146 * fVar52;
              auVar110._4_4_ = fVar148 * fVar53;
              auVar110._8_4_ = fVar149 * fVar54;
              auVar110._12_4_ = fVar150 * fVar85;
              auVar69 = vsubps_avx(auVar110,auVar47);
              auVar80 = vandps_avx(auVar77,auVar119);
              auVar44 = vandps_avx(auVar47,auVar119);
              auVar80 = vcmpps_avx(auVar80,auVar44,1);
              local_12f8 = vblendvps_avx(auVar69,auVar100,auVar80);
              auVar36._0_4_ = fVar156 * fVar52;
              auVar36._4_4_ = fVar159 * fVar53;
              auVar36._8_4_ = fVar160 * fVar54;
              auVar36._12_4_ = fVar161 * fVar85;
              auVar61._0_4_ = fVar162 * fVar156;
              auVar61._4_4_ = fVar167 * fVar159;
              auVar61._8_4_ = fVar169 * fVar160;
              auVar61._12_4_ = fVar171 * fVar161;
              auVar78._0_4_ = fVar173 * fVar163;
              auVar78._4_4_ = fVar175 * fVar168;
              auVar78._8_4_ = fVar176 * fVar170;
              auVar78._12_4_ = fVar177 * fVar172;
              auVar111._0_4_ = fVar163 * fVar151;
              auVar111._4_4_ = fVar168 * fVar153;
              auVar111._8_4_ = fVar170 * fVar154;
              auVar111._12_4_ = fVar172 * fVar155;
              auVar100 = vsubps_avx(auVar61,auVar78);
              auVar69 = vsubps_avx(auVar111,auVar36);
              auVar80 = vandps_avx(auVar78,auVar119);
              auVar44 = vandps_avx(auVar36,auVar119);
              auVar80 = vcmpps_avx(auVar80,auVar44,1);
              local_12e8 = vblendvps_avx(auVar69,auVar100,auVar80);
              fVar55 = local_1308._0_4_ * fStack_14e0 +
                       local_12f8._0_4_ * local_1508._4_4_ + local_12e8._0_4_ * fVar42;
              fVar52 = local_1308._4_4_ * fStack_14e0 +
                       local_12f8._4_4_ * local_1508._4_4_ + local_12e8._4_4_ * fVar42;
              fVar66 = local_1308._8_4_ * fStack_14e0 +
                       local_12f8._8_4_ * local_1508._4_4_ + local_12e8._8_4_ * fVar42;
              fVar42 = local_1308._12_4_ * fStack_14e0 +
                       local_12f8._12_4_ * local_1508._4_4_ + local_12e8._12_4_ * fVar42;
              auVar79._0_4_ = fVar55 + fVar55;
              auVar79._4_4_ = fVar52 + fVar52;
              auVar79._8_4_ = fVar66 + fVar66;
              auVar79._12_4_ = fVar42 + fVar42;
              fVar55 = local_1308._0_4_ * fVar92 +
                       local_12f8._0_4_ * fVar84 + local_12e8._0_4_ * fVar141;
              fVar65 = local_1308._4_4_ * fVar65 +
                       local_12f8._4_4_ * fVar95 + local_12e8._4_4_ * fVar143;
              fVar67 = local_1308._8_4_ * fVar68 +
                       local_12f8._8_4_ * fVar67 + local_12e8._8_4_ * fVar144;
              fVar68 = local_1308._12_4_ * fVar13 +
                       local_12f8._12_4_ * fVar12 + local_12e8._12_4_ * fVar145;
              auVar80 = vrcpps_avx(auVar79);
              fVar42 = auVar80._0_4_;
              auVar120._0_4_ = auVar79._0_4_ * fVar42;
              fVar84 = auVar80._4_4_;
              auVar120._4_4_ = auVar79._4_4_ * fVar84;
              fVar92 = auVar80._8_4_;
              auVar120._8_4_ = auVar79._8_4_ * fVar92;
              fVar95 = auVar80._12_4_;
              auVar120._12_4_ = auVar79._12_4_ * fVar95;
              auVar129._8_4_ = 0x3f800000;
              auVar129._0_8_ = 0x3f8000003f800000;
              auVar129._12_4_ = 0x3f800000;
              auVar80 = vsubps_avx(auVar129,auVar120);
              local_1318._0_4_ = (fVar55 + fVar55) * (fVar42 + fVar42 * auVar80._0_4_);
              local_1318._4_4_ = (fVar65 + fVar65) * (fVar84 + fVar84 * auVar80._4_4_);
              local_1318._8_4_ = (fVar67 + fVar67) * (fVar92 + fVar92 * auVar80._8_4_);
              local_1318._12_4_ = (fVar68 + fVar68) * (fVar95 + fVar95 * auVar80._12_4_);
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar112._4_4_ = uVar4;
              auVar112._0_4_ = uVar4;
              auVar112._8_4_ = uVar4;
              auVar112._12_4_ = uVar4;
              auVar80 = vcmpps_avx(auVar112,local_1318,2);
              fVar42 = ray->tfar;
              auVar121._4_4_ = fVar42;
              auVar121._0_4_ = fVar42;
              auVar121._8_4_ = fVar42;
              auVar121._12_4_ = fVar42;
              auVar44 = vcmpps_avx(local_1318,auVar121,2);
              auVar80 = vandps_avx(auVar80,auVar44);
              auVar44 = vcmpps_avx(auVar79,_DAT_01f7aa10,4);
              auVar80 = vandps_avx(auVar44,auVar80);
              auVar44 = vpand_avx(local_13e8,local_13f8);
              auVar80 = vpslld_avx(auVar80,0x1f);
              auVar80 = vpsrad_avx(auVar80,0x1f);
              local_1348 = vpand_avx(auVar80,auVar44);
              uVar24 = vmovmskps_avx(local_1348);
              if (uVar24 != 0) {
                local_1388 = local_13c8;
                local_1358 = &local_150d;
                auVar80 = vrcpps_avx(local_1368);
                fVar42 = auVar80._0_4_;
                auVar48._0_4_ = local_1368._0_4_ * fVar42;
                fVar84 = auVar80._4_4_;
                auVar48._4_4_ = local_1368._4_4_ * fVar84;
                fVar92 = auVar80._8_4_;
                auVar48._8_4_ = local_1368._8_4_ * fVar92;
                fVar95 = auVar80._12_4_;
                auVar48._12_4_ = local_1368._12_4_ * fVar95;
                auVar62._8_4_ = 0x3f800000;
                auVar62._0_8_ = 0x3f8000003f800000;
                auVar62._12_4_ = 0x3f800000;
                auVar80 = vsubps_avx(auVar62,auVar48);
                auVar37._0_4_ = fVar42 + fVar42 * auVar80._0_4_;
                auVar37._4_4_ = fVar84 + fVar84 * auVar80._4_4_;
                auVar37._8_4_ = fVar92 + fVar92 * auVar80._8_4_;
                auVar37._12_4_ = fVar95 + fVar95 * auVar80._12_4_;
                auVar49._8_4_ = 0x219392ef;
                auVar49._0_8_ = 0x219392ef219392ef;
                auVar49._12_4_ = 0x219392ef;
                auVar80 = vcmpps_avx(local_13d8,auVar49,5);
                auVar80 = vandps_avx(auVar80,auVar37);
                auVar50._0_4_ = local_13c8._0_4_ * auVar80._0_4_;
                auVar50._4_4_ = local_13c8._4_4_ * auVar80._4_4_;
                auVar50._8_4_ = local_13c8._8_4_ * auVar80._8_4_;
                auVar50._12_4_ = local_13c8._12_4_ * auVar80._12_4_;
                local_1338 = vminps_avx(auVar50,auVar62);
                auVar38._0_4_ = local_1378._0_4_ * auVar80._0_4_;
                auVar38._4_4_ = local_1378._4_4_ * auVar80._4_4_;
                auVar38._8_4_ = local_1378._8_4_ * auVar80._8_4_;
                auVar38._12_4_ = local_1378._12_4_ * auVar80._12_4_;
                local_1328 = vminps_avx(auVar38,auVar62);
                uVar22 = (ulong)(uVar24 & 0xff);
                do {
                  uVar26 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  local_1440 = *(uint *)((long)&local_1398 + uVar26 * 4);
                  pGVar11 = (local_14d0->geometries).items[local_1440].ptr;
                  if ((pGVar11->mask & ray->mask) == 0) {
                    uVar22 = uVar22 ^ 1L << (uVar26 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002eef9c;
                    local_14e8 = context->args;
                    local_1498._0_8_ = uVar22;
                    local_1488._0_8_ = uVar29;
                    local_1478._0_8_ = puVar28;
                    local_14f8._0_8_ = context;
                    local_1428.context = context->user;
                    local_1458 = *(undefined4 *)(local_1308 + uVar26 * 4);
                    local_1454 = *(undefined4 *)(local_12f8 + uVar26 * 4);
                    local_1450 = *(undefined4 *)(local_12e8 + uVar26 * 4);
                    local_144c = *(undefined4 *)(local_1338 + uVar26 * 4);
                    local_1448 = *(undefined4 *)(local_1328 + uVar26 * 4);
                    local_1444 = *(undefined4 *)((long)&local_13a8 + uVar26 * 4);
                    local_143c = (local_1428.context)->instID[0];
                    local_1438 = (local_1428.context)->instPrimID[0];
                    local_14b8._0_4_ = ray->tfar;
                    local_14a8._0_8_ = uVar26;
                    ray->tfar = *(float *)(local_1318 + uVar26 * 4);
                    local_150c = -1;
                    local_1428.valid = &local_150c;
                    local_1428.geometryUserPtr = pGVar11->userPtr;
                    local_1508 = ray;
                    local_1428.hit = (RTCHitN *)&local_1458;
                    local_1428.N = 1;
                    local_14c8._0_8_ = pGVar11;
                    local_1428.ray = (RTCRayN *)ray;
                    if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar11->occlusionFilterN)(&local_1428), *local_1428.valid != 0)) {
                      ray = local_1508;
                      if ((local_14e8->filter == (RTCFilterFunctionN)0x0) ||
                         (((local_14e8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_14c8._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002eef9c:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (*local_14e8->filter)(&local_1428);
                      ray = local_1508;
                      if (*local_1428.valid != 0) goto LAB_002eef9c;
                    }
                    local_1508->tfar = (float)local_14b8._0_4_;
                    uVar22 = local_1498._0_8_ ^ 1L << (local_14a8._0_8_ & 0x3f);
                    ray = local_1508;
                    context = (RayQueryContext *)local_14f8._0_8_;
                    puVar28 = (ulong *)local_1478._0_8_;
                    uVar29 = local_1488._0_8_;
                  }
                } while (uVar22 != 0);
              }
            }
            local_1460 = local_1460 + 1;
            auVar147 = ZEXT3264(local_1258);
            auVar152 = ZEXT3264(local_1278);
            auVar158 = ZEXT3264(local_1298);
            auVar166 = ZEXT3264(local_12b8);
            auVar174 = ZEXT3264(local_12d8);
          } while (local_1460 != local_1468);
        }
LAB_002eef8c:
      } while (puVar28 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }